

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O1

String * kj::getStackTrace(void)

{
  void **ppvVar1;
  size_t sVar2;
  char *pcVar3;
  char *in_RCX;
  String *in_RDI;
  ArrayPtr<void_*> space_00;
  void *space [32];
  ArrayPtr<void_*const> local_178;
  undefined8 *local_168;
  String local_158;
  _ local_138 [8];
  ArrayPtr<const_char> *local_130;
  ArrayPtr<const_char> local_128;
  kj local_118 [24];
  ArrayPtr<void_*const> in_stack_ffffffffffffff00;
  
  memset(local_118,0,0x100);
  space_00.size_ = 2;
  space_00.ptr = (void **)&DAT_00000020;
  local_178 = getStackTrace(local_118,space_00,(uint)in_RCX);
  strArray<kj::ArrayPtr<void*const>&>
            (&local_158,(kj *)&local_178,(ArrayPtr<void_*const> *)0x235f90,in_RCX);
  stringifyStackTrace(in_stack_ffffffffffffff00);
  local_130 = (ArrayPtr<const_char> *)(local_158.content.size_ - 1);
  if (local_158.content.size_ == 0) {
    local_130 = (ArrayPtr<const_char> *)0x0;
  }
  local_128.ptr = (char *)local_178.size_;
  if ((void **)local_178.size_ != (void **)0x0) {
    local_128.ptr = (char *)local_178.ptr;
  }
  local_128.size_ = (size_t)(local_178.size_ - 1);
  if ((void **)local_178.size_ == (void **)0x0) {
    local_128.size_ = (size_t)(ArrayPtr<const_char> *)0x0;
  }
  _::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (in_RDI,local_138,&local_128,(ArrayPtr<const_char> *)local_128.size_);
  ppvVar1 = local_178.ptr;
  if (local_178.ptr != (void **)0x0) {
    sVar2 = local_178.size_;
    local_178 = (ArrayPtr<void_*const>)ZEXT816(0);
    (**(code **)*local_168)(local_168,ppvVar1,1,sVar2,sVar2,0);
  }
  sVar2 = local_158.content.size_;
  pcVar3 = local_158.content.ptr;
  if (local_158.content.ptr != (char *)0x0) {
    local_158.content.ptr = (char *)0x0;
    local_158.content.size_ = 0;
    (**(local_158.content.disposer)->_vptr_ArrayDisposer)
              (local_158.content.disposer,pcVar3,1,sVar2,sVar2,0);
  }
  return in_RDI;
}

Assistant:

String getStackTrace() {
  void* space[32]{};
  auto trace = getStackTrace(space, 2);
  return kj::str(stringifyStackTraceAddresses(trace), stringifyStackTrace(trace));
}